

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O0

void libtorrent::aux::move_file(string *inf,string *newf,storage_error *se)

{
  undefined8 ec;
  bool bVar1;
  string local_70;
  file_status_flag_t local_4c;
  undefined1 local_48 [8];
  file_status s;
  storage_error *se_local;
  string *newf_local;
  string *inf_local;
  
  s._32_8_ = se;
  boost::system::error_code::clear(&se->ec);
  file_status::file_status((file_status *)local_48);
  ec = s._32_8_;
  libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::file_status_flag_tag,_void>::
  bitfield_flag(&local_4c);
  stat_file(inf,(file_status *)local_48,(error_code *)ec,local_4c);
  bVar1 = storage_error::operator_cast_to_bool((storage_error *)s._32_8_);
  if (bVar1) {
    *(undefined1 *)(s._32_8_ + 0x13) = 0x18;
  }
  else {
    bVar1 = has_parent_path(newf);
    if (bVar1) {
      parent_path(&local_70,newf);
      create_directories(&local_70,(error_code *)s._32_8_);
      ::std::__cxx11::string::~string((string *)&local_70);
      bVar1 = storage_error::operator_cast_to_bool((storage_error *)s._32_8_);
      if (bVar1) {
        *(undefined1 *)(s._32_8_ + 0x13) = 0x1f;
        return;
      }
    }
    rename((libtorrent *)inf,(char *)newf,(char *)s._32_8_);
    bVar1 = storage_error::operator_cast_to_bool((storage_error *)s._32_8_);
    if (bVar1) {
      *(undefined1 *)(s._32_8_ + 0x13) = 0x1d;
    }
  }
  return;
}

Assistant:

void move_file(std::string const& inf, std::string const& newf, storage_error& se)
	{
		se.ec.clear();

		file_status s;
		stat_file(inf, &s, se.ec);
		if (se)
		{
			se.operation = operation_t::file_stat;
			return;
		}

		if (has_parent_path(newf))
		{
			create_directories(parent_path(newf), se.ec);
			if (se)
			{
				se.operation = operation_t::mkdir;
				return;
			}
		}

		rename(inf, newf, se.ec);
		if (se)
			se.operation = operation_t::file_rename;
	}